

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_Minify(char *json)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  char *into;
  byte *pbVar4;
  
  pbVar4 = (byte *)json;
LAB_00107db1:
  bVar3 = *pbVar4;
  if (bVar3 < 0x20) {
    if (bVar3 < 10) {
      if (bVar3 == 9) goto LAB_00107de9;
      if (bVar3 == 0) {
        *json = 0;
        return;
      }
    }
    else if ((bVar3 == 10) || (bVar3 == 0xd)) {
LAB_00107de9:
      pbVar4 = pbVar4 + 1;
      goto LAB_00107db1;
    }
  }
  else if (bVar3 == 0x2f) {
    bVar2 = pbVar4[1];
    if (bVar2 == 0x2f) {
      while ((bVar2 != 0 && (bVar2 != 10))) {
        pbVar1 = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
        bVar2 = *pbVar1;
      }
      goto LAB_00107db1;
    }
    if (bVar2 == 0x2a) {
      pbVar4 = pbVar4 + 2;
      bVar3 = 0x2f;
      do {
        if (bVar3 == 0x2a) {
          bVar3 = pbVar4[-1];
          if (bVar3 == 0x2f) goto LAB_00107db1;
        }
        else {
          if (bVar3 == 0) goto LAB_00107db1;
          bVar3 = pbVar4[-1];
        }
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
  }
  else {
    if (bVar3 == 0x22) {
      *json = 0x22;
      do {
        bVar3 = pbVar4[1];
        if (bVar3 == 0x5c) {
          ((byte *)json)[1] = 0x5c;
          json = (char *)((byte *)json + 2);
          bVar3 = pbVar4[2];
          pbVar4 = pbVar4 + 2;
        }
        else {
          if ((bVar3 == 0) || (bVar3 == 0x22)) goto LAB_00107e67;
          json = (char *)((byte *)json + 1);
          pbVar4 = pbVar4 + 1;
        }
        *json = bVar3;
      } while( true );
    }
    if (bVar3 == 0x20) goto LAB_00107de9;
  }
  pbVar4 = pbVar4 + 1;
  *json = bVar3;
  json = (char *)((byte *)json + 1);
  goto LAB_00107db1;
LAB_00107e67:
  pbVar4 = pbVar4 + 2;
  ((byte *)json)[1] = bVar3;
  json = (char *)((byte *)json + 2);
  goto LAB_00107db1;
}

Assistant:

void cJSON_Minify(char *json)
{
	char *into=json;
	while (*json)
	{
		if (*json==' ') json++;
		else if (*json=='\t') json++;	/* Whitespace characters. */
		else if (*json=='\r') json++;
		else if (*json=='\n') json++;
		else if (*json=='/' && json[1]=='/')  while (*json && *json!='\n') json++;	/* double-slash comments, to end of line. */
		else if (*json=='/' && json[1]=='*') {while (*json && !(*json=='*' && json[1]=='/')) json++;json+=2;}	/* multiline comments. */
		else if (*json=='\"'){*into++=*json++;while (*json && *json!='\"'){if (*json=='\\') *into++=*json++;*into++=*json++;}*into++=*json++;} /* string literals, which are \" sensitive. */
		else *into++=*json++;			/* All other characters. */
	}
	*into=0;	/* and null-terminate. */
}